

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Ignored __thiscall
re2::CaptureNamesWalker::PreVisit(CaptureNamesWalker *this,Regexp *re,Ignored ignored,bool *stop)

{
  RegexpOp RVar1;
  string *psVar2;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar3;
  mapped_type *this_00;
  undefined4 in_stack_ffffffffffffffd0;
  key_type_conflict in_stack_ffffffffffffffd4;
  bool *stop_local;
  Ignored ignored_local;
  Regexp *re_local;
  CaptureNamesWalker *this_local;
  
  RVar1 = Regexp::op(re);
  if (RVar1 == kRegexpCapture) {
    psVar2 = Regexp::name_abi_cxx11_(re);
    if (psVar2 != (string *)0x0) {
      if (this->map_ ==
          (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x0) {
        pmVar3 = (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)operator_new(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        std::
        map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map(pmVar3);
        this->map_ = pmVar3;
      }
      psVar2 = Regexp::name_abi_cxx11_(re);
      pmVar3 = this->map_;
      Regexp::cap(re);
      this_00 = std::
                map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](pmVar3,(key_type_conflict *)&stack0xffffffffffffffd4);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar2)
      ;
    }
  }
  return ignored;
}

Assistant:

virtual Ignored PreVisit(Regexp* re, Ignored ignored, bool* stop) {
    if (re->op() == kRegexpCapture && re->name() != NULL) {
      // Allocate map once we find a name.
      if (map_ == NULL)
        map_ = new std::map<int, std::string>;

      (*map_)[re->cap()] = *re->name();
    }
    return ignored;
  }